

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

vm_tadsobj_hdr *
vm_tadsobj_hdr::expand_to
          (CVmObjTads *self,vm_tadsobj_hdr *hdr,size_t new_sc_cnt,size_t new_prop_cnt)

{
  vm_tadsobj_hdr *pvVar1;
  vm_tadsobj_hdr *pvVar2;
  long lVar3;
  CVmVarHeap *pCVar4;
  vm_tadsobj_hdr *in_RDX;
  undefined8 *in_RSI;
  vm_tadsobj_prop *entryp;
  size_t i;
  vm_tadsobj_hdr *new_hdr;
  vm_tadsobj_sc *__dest;
  vm_val_t *val;
  undefined8 in_stack_ffffffffffffffc8;
  CVmObjTads *in_stack_ffffffffffffffd0;
  
  pvVar1 = alloc(in_stack_ffffffffffffffd0,
                 (unsigned_short)((ulong)in_stack_ffffffffffffffc8 >> 0x30),
                 (unsigned_short)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  __dest = pvVar1->sc;
  val = (vm_val_t *)(in_RSI + 5);
  pvVar2 = in_RDX;
  if ((vm_tadsobj_hdr *)(ulong)*(ushort *)((long)in_RSI + 0x24) < in_RDX) {
    pvVar2 = (vm_tadsobj_hdr *)(ulong)*(ushort *)((long)in_RSI + 0x24);
  }
  memcpy(__dest,val,(long)pvVar2 << 4);
  pvVar1->li_obj_flags = *(unsigned_short *)(in_RSI + 1);
  pvVar1->intern_obj_flags = *(unsigned_short *)((long)in_RSI + 10);
  if (in_RDX != (vm_tadsobj_hdr *)(ulong)*(ushort *)((long)in_RSI + 0x24)) {
    inval_inh_path(pvVar2);
  }
  pvVar1->inh_path = (tadsobj_objid_and_ptr *)*in_RSI;
  lVar3 = in_RSI[3];
  for (pvVar2 = (vm_tadsobj_hdr *)(ulong)*(ushort *)((long)in_RSI + 0x22);
      pvVar2 != (vm_tadsobj_hdr *)0x0; pvVar2 = (vm_tadsobj_hdr *)((long)&pvVar2[-1].sc[0].objp + 7)
      ) {
    alloc_prop_entry(pvVar2,(vm_prop_id_t)((ulong)lVar3 >> 0x30),val,(uint)((ulong)__dest >> 0x20));
    lVar3 = lVar3 + 0x28;
  }
  pCVar4 = CVmMemory::get_var_heap(G_mem_X);
  (*pCVar4->_vptr_CVmVarHeap[6])(pCVar4,in_RSI);
  return pvVar1;
}

Assistant:

vm_tadsobj_hdr *vm_tadsobj_hdr::expand_to(VMG_ CVmObjTads *self,
                                          vm_tadsobj_hdr *hdr,
                                          size_t new_sc_cnt,
                                          size_t new_prop_cnt)
{
    vm_tadsobj_hdr *new_hdr;
    size_t i;
    vm_tadsobj_prop *entryp;

    /* allocate a new object at the expanded property table size */
    new_hdr = alloc(vmg_ self, (ushort)new_sc_cnt, (ushort)new_prop_cnt);

    /* copy the superclasses from the original object */
    memcpy(new_hdr->sc, hdr->sc,
           (hdr->sc_cnt < new_sc_cnt ? hdr->sc_cnt : new_sc_cnt)
           * sizeof(hdr->sc[0]));

    /* use the same flags from the original object */
    new_hdr->li_obj_flags = hdr->li_obj_flags;
    new_hdr->intern_obj_flags = hdr->intern_obj_flags;

    /* 
     *   if the superclass count is changing, we're obviously changing the
     *   inheritance structure, in which case the old cached inheritance path
     *   is invalid - delete it if so 
     */
    if (new_sc_cnt != hdr->sc_cnt)
        hdr->inval_inh_path();

    /* copy the old inheritance path (if we still have one) */
    new_hdr->inh_path = hdr->inh_path;

    /* 
     *   Run through all of the existing properties and duplicate them in the
     *   new object, to build the new object's hash table.  Note that the
     *   free index is inherently equivalent to the count of properties in
     *   use.  
     */
    for (i = hdr->prop_entry_free, entryp = hdr->prop_entry_arr ; i != 0 ;
         --i, ++entryp)
    {
        /* add this property to the new table */
        new_hdr->alloc_prop_entry(entryp->prop, &entryp->val, entryp->flags);
    }

    /* delete the old header */
    G_mem->get_var_heap()->free_mem(hdr);
    
    /* return the new header */
    return new_hdr;
}